

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledImage.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorTiledImageInstancer::DecoratorTiledImageInstancer(DecoratorTiledImageInstancer *this)

{
  allocator<char> local_91;
  String local_90;
  allocator<char> local_69;
  String local_68;
  allocator<char> local_31;
  String local_30;
  DecoratorTiledImageInstancer *local_10;
  DecoratorTiledImageInstancer *this_local;
  
  local_10 = this;
  DecoratorTiledInstancer::DecoratorTiledInstancer(&this->super_DecoratorTiledInstancer,1);
  (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTiledImageInstancer_00816240;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"image",&local_31);
  DecoratorTiledInstancer::RegisterTileProperty(&this->super_DecoratorTiledInstancer,&local_30,true)
  ;
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"decorator",&local_69);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"image",&local_91);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorTiledInstancer).super_DecoratorInstancer.
              super_EffectSpecification,&local_68,&local_90,RecursiveRepeat);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

DecoratorTiledImageInstancer::DecoratorTiledImageInstancer() : DecoratorTiledInstancer(1)
{
	RegisterTileProperty("image", true);
	RegisterShorthand("decorator", "image", ShorthandType::RecursiveRepeat);
}